

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void relational_suite::compare_integer_with_integer_literal(void)

{
  undefined1 local_c29;
  basic_variable<std::allocator<char>_> local_c28;
  undefined1 local_beb [2];
  undefined1 local_be9;
  basic_variable<std::allocator<char>_> local_be8;
  undefined1 local_bab [2];
  undefined1 local_ba9;
  basic_variable<std::allocator<char>_> local_ba8;
  undefined1 local_b6b [2];
  undefined1 local_b69;
  basic_variable<std::allocator<char>_> local_b68;
  undefined1 local_b2b [2];
  undefined1 local_b29;
  basic_variable<std::allocator<char>_> local_b28;
  undefined1 local_aeb [2];
  undefined1 local_ae9;
  basic_variable<std::allocator<char>_> local_ae8;
  undefined1 local_aab [2];
  undefined1 local_aa9;
  basic_variable<std::allocator<char>_> local_aa8;
  undefined1 local_a6b [2];
  undefined1 local_a69;
  basic_variable<std::allocator<char>_> local_a68;
  undefined1 local_a2b [2];
  undefined1 local_a29;
  basic_variable<std::allocator<char>_> local_a28;
  undefined1 local_9eb [2];
  undefined1 local_9e9;
  basic_variable<std::allocator<char>_> local_9e8;
  undefined1 local_9ab [2];
  undefined1 local_9a9;
  basic_variable<std::allocator<char>_> local_9a8;
  undefined1 local_96b [2];
  undefined1 local_969;
  basic_variable<std::allocator<char>_> local_968;
  undefined1 local_92b [2];
  undefined1 local_929;
  basic_variable<std::allocator<char>_> local_928;
  undefined1 local_8eb [2];
  undefined1 local_8e9;
  basic_variable<std::allocator<char>_> local_8e8;
  undefined1 local_8ab [2];
  undefined1 local_8a9;
  basic_variable<std::allocator<char>_> local_8a8;
  undefined1 local_86b [2];
  undefined1 local_869;
  basic_variable<std::allocator<char>_> local_868;
  undefined1 local_82b [2];
  undefined1 local_829;
  basic_variable<std::allocator<char>_> local_828;
  undefined1 local_7eb [2];
  undefined1 local_7e9;
  basic_variable<std::allocator<char>_> local_7e8;
  undefined1 local_7ab [2];
  undefined1 local_7a9;
  basic_variable<std::allocator<char>_> local_7a8;
  undefined1 local_76b [2];
  undefined1 local_769;
  basic_variable<std::allocator<char>_> local_768;
  undefined1 local_72b [2];
  undefined1 local_729;
  basic_variable<std::allocator<char>_> local_728;
  undefined1 local_6eb [2];
  undefined1 local_6e9;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6ab [2];
  undefined1 local_6a9;
  basic_variable<std::allocator<char>_> local_6a8;
  undefined1 local_66b [2];
  undefined1 local_669;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62a [2];
  uint local_628 [2];
  uint two_1;
  uint one_1;
  uint zero_1;
  undefined1 local_5db [2];
  undefined1 local_5d9;
  basic_variable<std::allocator<char>_> local_5d8;
  undefined1 local_59b [2];
  undefined1 local_599;
  basic_variable<std::allocator<char>_> local_598;
  undefined1 local_55b [2];
  undefined1 local_559;
  basic_variable<std::allocator<char>_> local_558;
  undefined1 local_51b [2];
  undefined1 local_519;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  undefined1 local_49b [2];
  undefined1 local_499;
  basic_variable<std::allocator<char>_> local_498;
  undefined1 local_45b [2];
  undefined1 local_459;
  basic_variable<std::allocator<char>_> local_458;
  undefined1 local_41b [2];
  undefined1 local_419;
  basic_variable<std::allocator<char>_> local_418;
  undefined1 local_3db [2];
  undefined1 local_3d9;
  basic_variable<std::allocator<char>_> local_3d8;
  undefined1 local_39b [2];
  undefined1 local_399;
  basic_variable<std::allocator<char>_> local_398;
  undefined1 local_35b [2];
  undefined1 local_359;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  undefined1 local_2db [2];
  undefined1 local_2d9;
  basic_variable<std::allocator<char>_> local_2d8;
  undefined1 local_29b [2];
  undefined1 local_299;
  basic_variable<std::allocator<char>_> local_298;
  undefined1 local_25b [2];
  undefined1 local_259;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_21b [2];
  undefined1 local_219;
  basic_variable<std::allocator<char>_> local_218;
  undefined1 local_1db [2];
  undefined1 local_1d9;
  basic_variable<std::allocator<char>_> local_1d8;
  undefined1 local_19b [2];
  undefined1 local_199;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  undefined1 local_11b [2];
  undefined1 local_119;
  basic_variable<std::allocator<char>_> local_118;
  undefined1 local_db [2];
  undefined1 local_d9;
  basic_variable<std::allocator<char>_> local_d8;
  undefined1 local_9b [2];
  undefined1 local_99;
  basic_variable<std::allocator<char>_> local_98;
  undefined1 local_5e [21];
  undefined1 local_49;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_16 [2];
  int local_14 [2];
  int two;
  int one;
  int zero;
  
  two = 0;
  local_14[1] = 1;
  local_14[0] = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_48,0);
  local_16[0] = trial::dynamic::operator<(&local_48,&two);
  local_49 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135a,"void relational_suite::compare_integer_with_integer_literal()",local_16,
             &local_49);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_98,0);
  local_5e[0] = trial::dynamic::operator<=(&local_98,&two);
  local_99 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135b,"void relational_suite::compare_integer_with_integer_literal()",local_5e,
             &local_99);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_98);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_d8,0);
  local_9b[0] = trial::dynamic::operator>(&local_d8,&two);
  local_d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135c,"void relational_suite::compare_integer_with_integer_literal()",local_9b,
             &local_d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_118,0);
  local_db[0] = trial::dynamic::operator>=(&local_118,&two);
  local_119 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135d,"void relational_suite::compare_integer_with_integer_literal()",local_db,
             &local_119);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_118);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,0);
  local_11b[0] = trial::dynamic::operator<(&local_158,local_14 + 1);
  local_159 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x135f,"void relational_suite::compare_integer_with_integer_literal()",local_11b,
             &local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_198,0);
  local_15b[0] = trial::dynamic::operator<=(&local_198,local_14 + 1);
  local_199 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1360,"void relational_suite::compare_integer_with_integer_literal()",local_15b,
             &local_199);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1d8,0);
  local_19b[0] = trial::dynamic::operator>(&local_1d8,local_14 + 1);
  local_1d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1361,"void relational_suite::compare_integer_with_integer_literal()",local_19b,
             &local_1d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_218,0);
  local_1db[0] = trial::dynamic::operator>=(&local_218,local_14 + 1);
  local_219 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1362,"void relational_suite::compare_integer_with_integer_literal()",local_1db,
             &local_219);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_258,0);
  local_21b[0] = trial::dynamic::operator<(&local_258,local_14);
  local_259 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1364,"void relational_suite::compare_integer_with_integer_literal()",local_21b,
             &local_259);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_298,0);
  local_25b[0] = trial::dynamic::operator<=(&local_298,local_14);
  local_299 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1365,"void relational_suite::compare_integer_with_integer_literal()",local_25b,
             &local_299);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_298);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2d8,0);
  local_29b[0] = trial::dynamic::operator>(&local_2d8,local_14);
  local_2d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1366,"void relational_suite::compare_integer_with_integer_literal()",local_29b,
             &local_2d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_318,0);
  local_2db[0] = trial::dynamic::operator>=(&local_318,local_14);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1367,"void relational_suite::compare_integer_with_integer_literal()",local_2db,
             &local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_358,1);
  local_31b[0] = trial::dynamic::operator<(&local_358,&two);
  local_359 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1369,"void relational_suite::compare_integer_with_integer_literal()",local_31b,
             &local_359);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_398,1);
  local_35b[0] = trial::dynamic::operator<=(&local_398,&two);
  local_399 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x136a,"void relational_suite::compare_integer_with_integer_literal()",local_35b,
             &local_399);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_398);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_3d8,1);
  local_39b[0] = trial::dynamic::operator>(&local_3d8,&two);
  local_3d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x136b,"void relational_suite::compare_integer_with_integer_literal()",local_39b,
             &local_3d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_418,1);
  local_3db[0] = trial::dynamic::operator>=(&local_418,&two);
  local_419 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x136c,"void relational_suite::compare_integer_with_integer_literal()",local_3db,
             &local_419);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_458,1);
  local_41b[0] = trial::dynamic::operator<(&local_458,local_14 + 1);
  local_459 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x136e,"void relational_suite::compare_integer_with_integer_literal()",local_41b,
             &local_459);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_458);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_498,1);
  local_45b[0] = trial::dynamic::operator<=(&local_498,local_14 + 1);
  local_499 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x136f,"void relational_suite::compare_integer_with_integer_literal()",local_45b,
             &local_499);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_498);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_4d8,1);
  local_49b[0] = trial::dynamic::operator>(&local_4d8,local_14 + 1);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1370,"void relational_suite::compare_integer_with_integer_literal()",local_49b,
             &local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_518,1);
  local_4db[0] = trial::dynamic::operator>=(&local_518,local_14 + 1);
  local_519 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1371,"void relational_suite::compare_integer_with_integer_literal()",local_4db,
             &local_519);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_558,1);
  local_51b[0] = trial::dynamic::operator<(&local_558,local_14);
  local_559 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1373,"void relational_suite::compare_integer_with_integer_literal()",local_51b,
             &local_559);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_558);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_598,1);
  local_55b[0] = trial::dynamic::operator<=(&local_598,local_14);
  local_599 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1374,"void relational_suite::compare_integer_with_integer_literal()",local_55b,
             &local_599);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_598);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_5d8,1);
  local_59b[0] = trial::dynamic::operator>(&local_5d8,local_14);
  local_5d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1375,"void relational_suite::compare_integer_with_integer_literal()",local_59b,
             &local_5d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&zero_1,1);
  local_5db[0] = trial::dynamic::operator>=
                           ((basic_variable<std::allocator<char>_> *)&zero_1,local_14);
  one_1._3_1_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1376,"void relational_suite::compare_integer_with_integer_literal()",local_5db,
             (long)&one_1 + 3);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&zero_1);
  two_1 = 0;
  local_628[1] = 1;
  local_628[0] = 2;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_668,0);
  local_62a[0] = trial::dynamic::operator<(&local_668,&two_1);
  local_669 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x137d,"void relational_suite::compare_integer_with_integer_literal()",local_62a,
             &local_669);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_6a8,0);
  local_66b[0] = trial::dynamic::operator<=(&local_6a8,&two_1);
  local_6a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x137e,"void relational_suite::compare_integer_with_integer_literal()",local_66b,
             &local_6a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_6e8,0);
  local_6ab[0] = trial::dynamic::operator>(&local_6e8,&two_1);
  local_6e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x137f,"void relational_suite::compare_integer_with_integer_literal()",local_6ab,
             &local_6e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_728,0);
  local_6eb[0] = trial::dynamic::operator>=(&local_728,&two_1);
  local_729 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1380,"void relational_suite::compare_integer_with_integer_literal()",local_6eb,
             &local_729);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_728);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_768,0);
  local_72b[0] = trial::dynamic::operator<(&local_768,local_628 + 1);
  local_769 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1382,"void relational_suite::compare_integer_with_integer_literal()",local_72b,
             &local_769);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_7a8,0);
  local_76b[0] = trial::dynamic::operator<=(&local_7a8,local_628 + 1);
  local_7a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1383,"void relational_suite::compare_integer_with_integer_literal()",local_76b,
             &local_7a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_7e8,0);
  local_7ab[0] = trial::dynamic::operator>(&local_7e8,local_628 + 1);
  local_7e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1384,"void relational_suite::compare_integer_with_integer_literal()",local_7ab,
             &local_7e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_828,0);
  local_7eb[0] = trial::dynamic::operator>=(&local_828,local_628 + 1);
  local_829 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1385,"void relational_suite::compare_integer_with_integer_literal()",local_7eb,
             &local_829);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_828);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_868,0);
  local_82b[0] = trial::dynamic::operator<(&local_868,local_628);
  local_869 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) < two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,4999,"void relational_suite::compare_integer_with_integer_literal()",local_82b,
             &local_869);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_868);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_8a8,0);
  local_86b[0] = trial::dynamic::operator<=(&local_8a8,local_628);
  local_8a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) <= two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,5000,"void relational_suite::compare_integer_with_integer_literal()",local_86b,
             &local_8a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_8e8,0);
  local_8ab[0] = trial::dynamic::operator>(&local_8e8,local_628);
  local_8e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) > two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1389,"void relational_suite::compare_integer_with_integer_literal()",local_8ab,
             &local_8e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_928,0);
  local_8eb[0] = trial::dynamic::operator>=(&local_928,local_628);
  local_929 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) >= two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138a,"void relational_suite::compare_integer_with_integer_literal()",local_8eb,
             &local_929);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_928);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_968,1);
  local_92b[0] = trial::dynamic::operator<(&local_968,&two_1);
  local_969 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138c,"void relational_suite::compare_integer_with_integer_literal()",local_92b,
             &local_969);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_968);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_9a8,1);
  local_96b[0] = trial::dynamic::operator<=(&local_9a8,&two_1);
  local_9a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= zero","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138d,"void relational_suite::compare_integer_with_integer_literal()",local_96b,
             &local_9a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_9e8,1);
  local_9ab[0] = trial::dynamic::operator>(&local_9e8,&two_1);
  local_9e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138e,"void relational_suite::compare_integer_with_integer_literal()",local_9ab,
             &local_9e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_9e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_a28,1);
  local_9eb[0] = trial::dynamic::operator>=(&local_a28,&two_1);
  local_a29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= zero","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x138f,"void relational_suite::compare_integer_with_integer_literal()",local_9eb,
             &local_a29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_a68,1);
  local_a2b[0] = trial::dynamic::operator<(&local_a68,local_628 + 1);
  local_a69 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1391,"void relational_suite::compare_integer_with_integer_literal()",local_a2b,
             &local_a69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_a68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_aa8,1);
  local_a6b[0] = trial::dynamic::operator<=(&local_aa8,local_628 + 1);
  local_aa9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1392,"void relational_suite::compare_integer_with_integer_literal()",local_a6b,
             &local_aa9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_aa8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_ae8,1);
  local_aab[0] = trial::dynamic::operator>(&local_ae8,local_628 + 1);
  local_ae9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > one","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1393,"void relational_suite::compare_integer_with_integer_literal()",local_aab,
             &local_ae9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ae8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_b28,1);
  local_aeb[0] = trial::dynamic::operator>=(&local_b28,local_628 + 1);
  local_b29 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= one","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1394,"void relational_suite::compare_integer_with_integer_literal()",local_aeb,
             &local_b29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b28);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_b68,1);
  local_b2b[0] = trial::dynamic::operator<(&local_b68,local_628);
  local_b69 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) < two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1396,"void relational_suite::compare_integer_with_integer_literal()",local_b2b,
             &local_b69);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b68);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_ba8,1);
  local_b6b[0] = trial::dynamic::operator<=(&local_ba8,local_628);
  local_ba9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) <= two","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1397,"void relational_suite::compare_integer_with_integer_literal()",local_b6b,
             &local_ba9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_ba8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_be8,1);
  local_bab[0] = trial::dynamic::operator>(&local_be8,local_628);
  local_be9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) > two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1398,"void relational_suite::compare_integer_with_integer_literal()",local_bab,
             &local_be9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_be8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_c28,1);
  local_beb[0] = trial::dynamic::operator>=(&local_c28,local_628);
  local_c29 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) >= two","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1399,"void relational_suite::compare_integer_with_integer_literal()",local_beb,
             &local_c29);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_c28);
  return;
}

Assistant:

void compare_integer_with_integer_literal()
{
    {
        const signed int zero = 0;
        const signed int one = 1;
        const signed int two = 2;

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= one, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > two, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= two, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= one, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > two, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= two, false);
    }
    {
        const unsigned int zero = 0U;
        const unsigned int one = 1U;
        const unsigned int two = 2U;

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= one, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) < two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) <= two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) > two, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) >= two, false);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= zero, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > zero, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= zero, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= one, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > one, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= one, true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) < two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) <= two, true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) > two, false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) >= two, false);
    }
}